

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O2

child_iterator * __thiscall
Archive::child_begin(child_iterator *__return_storage_ptr__,Archive *this,bool SkipInternal)

{
  pointer pcVar1;
  uint8_t *data;
  Child local_30;
  
  pcVar1 = (this->data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish == pcVar1) {
    (__return_storage_ptr__->child).parent = (Archive *)0x0;
    (__return_storage_ptr__->child).data = (uint8_t *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->child).data + 6) = 0;
    __return_storage_ptr__->error = false;
  }
  else {
    if (SkipInternal) {
      (__return_storage_ptr__->child).parent = (Archive *)0x0;
      (__return_storage_ptr__->child).data = (uint8_t *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->child).data + 6) = 0;
      __return_storage_ptr__->error = false;
      data = this->firstRegularData;
    }
    else {
      (__return_storage_ptr__->child).parent = (Archive *)0x0;
      (__return_storage_ptr__->child).data = (uint8_t *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->child).data + 6) = 0;
      data = (uint8_t *)(pcVar1 + 8);
      __return_storage_ptr__->error = false;
    }
    Child::Child(&local_30,this,data,&__return_storage_ptr__->error);
    *(ulong *)((long)&(__return_storage_ptr__->child).data + 6) =
         CONCAT62(local_30._16_6_,local_30.data._6_2_);
    (__return_storage_ptr__->child).parent = local_30.parent;
    (__return_storage_ptr__->child).data =
         (uint8_t *)CONCAT26(local_30.data._6_2_,local_30.data._0_6_);
  }
  return __return_storage_ptr__;
}

Assistant:

Archive::child_iterator Archive::child_begin(bool SkipInternal) const {
  if (data.size() == 0) {
    return child_end();
  }

  if (SkipInternal) {
    child_iterator it;
    it.child = Child(this, firstRegularData, &it.error);
    return it;
  }

  auto* loc = (const uint8_t*)data.data() + strlen(magic);
  child_iterator it;
  it.child = Child(this, loc, &it.error);
  return it;
}